

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O1

void __thiscall AsyncRgbLedAnalyzer::WorkerThread(AsyncRgbLedAnalyzer *this)

{
  bool bVar1;
  uint uVar2;
  AnalyzerChannelData *pAVar3;
  double dVar4;
  AsyncRgbLedAnalyzerSettings *this_00;
  FrameV2 frame_v2;
  Frame frame;
  RGBResult result;
  FrameV2 aFStack_98 [8];
  BitTiming local_90;
  undefined1 local_60 [2];
  RGBValue local_5e;
  double local_50;
  double dStack_48;
  
  uVar2 = Analyzer::GetSampleRate();
  this->mSampleRateHz = (double)uVar2;
  pAVar3 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mChannelData = pAVar3;
  bVar1 = AsyncRgbLedAnalyzerSettings::IsHighSpeedSupported
                    ((this->mSettings)._M_t.
                     super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                     .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
  if (!bVar1) {
    AsyncRgbLedAnalyzerSettings::DataTiming
              (&local_90,
               (this->mSettings)._M_t.
               super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,BIT_LOW,
               false);
    this_00 = (this->mSettings)._M_t.
              super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
              ._M_t.
              super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
              .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl;
  }
  else {
    AsyncRgbLedAnalyzerSettings::DataTiming
              (&local_90,
               (this->mSettings)._M_t.
               super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,BIT_LOW,
               true);
    this_00 = (this->mSettings)._M_t.
              super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
              ._M_t.
              super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
              .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl;
  }
  AsyncRgbLedAnalyzerSettings::DataTiming((BitTiming *)local_60,this_00,BIT_HIGH,bVar1);
  dVar4 = dStack_48;
  if (local_90.mNegativeTiming.mMinimumSec <= dStack_48) {
    dVar4 = local_90.mNegativeTiming.mMinimumSec;
  }
  this->mMinimumLowDurationSec = dVar4;
  bVar1 = true;
  do {
    if (bVar1) {
      SynchronizeToReset(this);
      bVar1 = false;
    }
    this->mFirstBitAfterReset = true;
    AnalyzerResults::CommitPacketAndStartNewPacket();
    dVar4 = 0.0;
    do {
      ReadRGBTriple((RGBResult *)local_60,this);
      if (local_60[0] == true) {
        Frame::Frame((Frame *)&local_90);
        local_90.mNegativeTiming.mNominalSec._1_1_ = 0;
        local_90.mPositiveTiming.mMinimumSec = local_50;
        local_90.mPositiveTiming.mNominalSec = dStack_48;
        local_90.mPositiveTiming.mMaximumSec = (double)RGBValue::ConvertToU64(&local_5e);
        local_90.mNegativeTiming.mMinimumSec = dVar4;
        AnalyzerResults::AddFrame
                  ((Frame *)(this->mResults)._M_t.
                            super___uniq_ptr_impl<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerResults_*,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
                            .super__Head_base<0UL,_AsyncRgbLedAnalyzerResults_*,_false>._M_head_impl
                  );
        FrameV2::FrameV2(aFStack_98);
        FrameV2::AddInteger((char *)aFStack_98,0x10a038);
        FrameV2::AddInteger((char *)aFStack_98,0x10a03e);
        FrameV2::AddInteger((char *)aFStack_98,0x10a042);
        FrameV2::AddInteger((char *)aFStack_98,0x10a048);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerResults_*,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
                   .super__Head_base<0UL,_AsyncRgbLedAnalyzerResults_*,_false>._M_head_impl,
                   (char *)aFStack_98,0x10a04d,(ulonglong)local_90.mPositiveTiming.mMinimumSec);
        AnalyzerResults::CommitResults();
        dVar4 = (double)(ulong)(SUB84(dVar4,0) + 1);
        FrameV2::~FrameV2(aFStack_98);
        Frame::~Frame((Frame *)&local_90);
      }
      else {
        bVar1 = true;
      }
    } while ((!bVar1) && ((local_60[1] & 1U) == 0));
    AnalyzerResults::CommitResults();
    AnalyzerChannelData::GetSampleNumber();
    Analyzer::ReportProgress((ulonglong)this);
  } while( true );
}

Assistant:

void AsyncRgbLedAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();
    mChannelData = GetAnalyzerChannelData( mSettings->mInputChannel );

    // cache this value here to avoid recomputing this every bit-read
    if( mSettings->IsHighSpeedSupported() )
    {
        mMinimumLowDurationSec = std::min( mSettings->DataTiming( BIT_LOW, true ).mNegativeTiming.mMinimumSec,
                                           mSettings->DataTiming( BIT_HIGH, true ).mNegativeTiming.mMinimumSec );
    }
    else
    {
        mMinimumLowDurationSec = std::min( mSettings->DataTiming( BIT_LOW ).mNegativeTiming.mMinimumSec,
                                           mSettings->DataTiming( BIT_HIGH ).mNegativeTiming.mMinimumSec );
    }

    bool isResyncNeeded = true;

    for( ;; )
    {
        if( isResyncNeeded )
        {
            SynchronizeToReset();
            isResyncNeeded = false;
        }

        mFirstBitAfterReset = true;
        U32 frameInPacketIndex = 0;
        mResults->CommitPacketAndStartNewPacket();

        // data word reading loop
        for( ;; )
        {
            auto result = ReadRGBTriple();

            if( result.mValid )
            {
                Frame frame;
                frame.mFlags = 0;
                frame.mStartingSampleInclusive = result.mValueBeginSample;
                frame.mEndingSampleInclusive = result.mValueEndSample;
                frame.mData1 = result.mRGB.ConvertToU64();
                frame.mData2 = frameInPacketIndex++;
                mResults->AddFrame( frame );

                FrameV2 frame_v2;
                frame_v2.AddInteger( "index", frame.mData2 );
                frame_v2.AddInteger( "red", result.mRGB.red );
                frame_v2.AddInteger( "green", result.mRGB.green );
                frame_v2.AddInteger( "blue", result.mRGB.blue );
                mResults->AddFrameV2( frame_v2, "pixel", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );

                mResults->CommitResults();
            }
            else
            {
                // something error occurred, let's resynchronise
                isResyncNeeded = true;
            }

            if( isResyncNeeded || result.mIsReset )
            {
                break;
            }
        }

        mResults->CommitResults();
        ReportProgress( mChannelData->GetSampleNumber() );
    }
}